

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_core.cpp
# Opt level: O1

void __thiscall
so_5::impl::layer_core_t::add_extra_layer(layer_core_t *this,type_index *type,layer_ref_t *layer)

{
  typed_layer_ref_t *ptVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<const_so_5::impl::typed_layer_ref_t_*,_std::vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>_>
  _Var4;
  __normal_iterator<so_5::impl::typed_layer_ref_t_*,_std::vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>_>
  __position;
  typed_layer_ref_t typed_layer;
  undefined1 local_70 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  
  if ((layer->super___shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    local_70._0_8_ = (type_info *)&local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"trying to add nullptr extra layer","");
    exception_t::raise(0x24dc27);
    if ((type_info *)local_70._0_8_ != (type_info *)&local_60) {
      operator_delete((void *)local_70._0_8_);
    }
  }
  ptVar1 = (this->m_default_layers).
           super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var4 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<so_5::impl::typed_layer_ref_t_const*,std::vector<so_5::impl::typed_layer_ref_t,std::allocator<so_5::impl::typed_layer_ref_t>>>,std::type_index,__gnu_cxx::__ops::_Iter_comp_val<so_5::impl::search_for_layer(std::vector<so_5::impl::typed_layer_ref_t,std::allocator<so_5::impl::typed_layer_ref_t>>const&,std::type_index_const&)::_lambda(so_5::impl::typed_layer_ref_t_const&,std::type_index_const&)_1_>>
                    ((this->m_default_layers).
                     super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
                     ._M_impl.super__Vector_impl_data._M_start,ptVar1,type);
  if (_Var4._M_current ==
      (this->m_default_layers).
      super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002197b5:
    _Var4._M_current =
         (this->m_default_layers).
         super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar2 = std::type_index::operator==(&(_Var4._M_current)->m_true_type,type);
    if (!bVar2) goto LAB_002197b5;
  }
  if (ptVar1 != _Var4._M_current) {
    local_70._0_8_ = (type_info *)&local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"trying to add extra layer that already exists in default list",""
              );
    exception_t::raise(0x24dc27);
    if ((type_info *)local_70._0_8_ != (type_info *)&local_60) {
      operator_delete((void *)local_70._0_8_);
    }
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_extra_layers_lock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  ptVar1 = (this->m_extra_layers).
           super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var4 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<so_5::impl::typed_layer_ref_t_const*,std::vector<so_5::impl::typed_layer_ref_t,std::allocator<so_5::impl::typed_layer_ref_t>>>,std::type_index,__gnu_cxx::__ops::_Iter_comp_val<so_5::impl::search_for_layer(std::vector<so_5::impl::typed_layer_ref_t,std::allocator<so_5::impl::typed_layer_ref_t>>const&,std::type_index_const&)::_lambda(so_5::impl::typed_layer_ref_t_const&,std::type_index_const&)_1_>>
                    ((this->m_extra_layers).
                     super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
                     ._M_impl.super__Vector_impl_data._M_start,ptVar1,type);
  if (_Var4._M_current !=
      (this->m_extra_layers).
      super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = std::type_index::operator==(&(_Var4._M_current)->m_true_type,type);
    if (bVar2) goto LAB_0021984c;
  }
  _Var4._M_current =
       (this->m_extra_layers).
       super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
LAB_0021984c:
  if (ptVar1 != _Var4._M_current) {
    local_70._0_8_ = (type_info *)&local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"trying to add extra layer that already exists in extra list","");
    exception_t::raise(0x24dc27);
    if ((type_info *)local_70._0_8_ != (type_info *)&local_60) {
      operator_delete((void *)local_70._0_8_);
    }
  }
  layer_t::bind_to_environment
            ((layer->super___shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             this->m_env);
  (*((layer->super___shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_layer_t
    [2])();
  typed_layer_ref_t::typed_layer_ref_t((typed_layer_ref_t *)local_70,type,layer);
  __position = std::
               __lower_bound<__gnu_cxx::__normal_iterator<so_5::impl::typed_layer_ref_t*,std::vector<so_5::impl::typed_layer_ref_t,std::allocator<so_5::impl::typed_layer_ref_t>>>,so_5::impl::typed_layer_ref_t,__gnu_cxx::__ops::_Iter_less_val>
                         ((this->m_extra_layers).
                          super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->m_extra_layers).
                          super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish,local_70);
  std::vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>::insert
            (&this->m_extra_layers,(const_iterator)__position._M_current,(value_type *)local_70);
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_extra_layers_lock);
  return;
}

Assistant:

void
layer_core_t::add_extra_layer(
	const std::type_index & type,
	const layer_ref_t & layer )
{
	if( nullptr == layer.get() )
		SO_5_THROW_EXCEPTION(
			rc_trying_to_add_nullptr_extra_layer,
			"trying to add nullptr extra layer" );

	if( m_default_layers.end() != search_for_layer( m_default_layers, type ) )
		SO_5_THROW_EXCEPTION(
			rc_trying_to_add_extra_layer_that_already_exists_in_default_list,
			"trying to add extra layer that already exists in default list" );

	std::lock_guard< std::mutex > lock( m_extra_layers_lock );

	if( m_extra_layers.end() != search_for_layer( m_extra_layers, type ) )
		SO_5_THROW_EXCEPTION(
			rc_trying_to_add_extra_layer_that_already_exists_in_extra_list,
			"trying to add extra layer that already exists in extra list" );

	layer->bind_to_environment( &m_env );

	try
	{
		layer->start();
	}
	catch( const std::exception & x )
	{
		SO_5_THROW_EXCEPTION(
			rc_unable_to_start_extra_layer,
			std::string( "layer raised an exception: " ) + x.what() );
	}

	try
	{
		typed_layer_ref_t typed_layer( type, layer );

		m_extra_layers.insert(
			std::lower_bound(
				m_extra_layers.begin(),
				m_extra_layers.end(),
				typed_layer ),
			typed_layer );
	}
	catch( const std::exception & x )
	{
		// Unable to store layer. Layer must be stopped...
		layer->shutdown();
		layer->wait();

		// ...And error must be reported.
		SO_5_THROW_EXCEPTION(
			rc_unable_to_start_extra_layer,
			std::string( "unable to store pointer to layer, exception: " ) +
				x.what() );
	}
}